

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O1

Am_Priority_List_Item * __thiscall
Am_Priority_List::take_out_obj(Am_Priority_List *this,Am_Object *obj)

{
  Am_Priority_List_Item *pAVar1;
  bool bVar2;
  Am_Priority_List_Item **ppAVar3;
  Am_Priority_List_Item *this_00;
  
  this_00 = this->head;
  if (this_00 != (Am_Priority_List_Item *)0x0) {
    do {
      bVar2 = Am_Object::operator==(&this_00->obj,obj);
      if (bVar2) {
        if (this->current == this_00) {
          this->current = this_00->prev;
        }
        pAVar1 = this_00->prev;
        ppAVar3 = &pAVar1->next;
        if (pAVar1 == (Am_Priority_List_Item *)0x0) {
          ppAVar3 = &this->head;
        }
        *ppAVar3 = this_00->next;
        ppAVar3 = &this_00->next->prev;
        if (this_00->next == (Am_Priority_List_Item *)0x0) {
          ppAVar3 = &this->tail;
        }
        *ppAVar3 = pAVar1;
        return this_00;
      }
      this_00 = this_00->next;
    } while (this_00 != (Am_Priority_List_Item *)0x0);
  }
  return (Am_Priority_List_Item *)0x0;
}

Assistant:

Am_Priority_List_Item *
Am_Priority_List::take_out_obj(Am_Object obj)
{
  Am_Priority_List_Item *p = head;
  for (; p != nullptr; p = p->next) {
    if (p->obj == obj)
      return this->take_out_item(p);
  }
  return nullptr;
}